

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

void __thiscall Js::ByteCodeCache::Initialize(ByteCodeCache *this,ScriptContext *scriptContext)

{
  uint uVar1;
  ByteCodeBufferReader *pBVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  PropertyId *pPVar7;
  long lVar8;
  byte **ppbVar9;
  byte *buffer;
  byte *pbVar10;
  int iVar11;
  size_t requestedBytes;
  ulong uVar12;
  undefined8 uStack_38;
  int offset;
  
  iVar11 = this->reader->string16Count;
  this->propertyCount = iVar11;
  uStack_38 = in_RAX;
  if ((long)iVar11 == 0) {
    pPVar7 = (PropertyId *)&DAT_00000008;
  }
  else {
    requestedBytes = 0xffffffffffffffff;
    if (-1 < iVar11) {
      requestedBytes = (long)iVar11 << 2;
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00879f95;
      *puVar6 = 0;
    }
    pPVar7 = (PropertyId *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(&(scriptContext->sourceCodeAllocator).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,requestedBytes);
    if (pPVar7 == (PropertyId *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00879f95;
      *puVar6 = 0;
    }
  }
  this->propertyIds = pPVar7;
  if (0 < this->propertyCount) {
    lVar8 = 0;
    do {
      pPVar7[lVar8] = -1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->propertyCount);
  }
  this->raw = this->reader->raw;
  if (0 < this->propertyCount) {
    iVar11 = 0;
    do {
      PopulateLookupPropertyId(this,scriptContext,iVar11);
      iVar11 = iVar11 + 1;
    } while (iVar11 < this->propertyCount);
  }
  uVar1 = this->reader->scopeInfoCount;
  this->scopeInfoCount = uVar1;
  if ((ulong)uVar1 != 0) {
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00879f95;
      *puVar6 = 0;
    }
    ppbVar9 = (byte **)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                       AllocInternal(&(scriptContext->sourceCodeAllocator).
                                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                     ,(ulong)uVar1 << 3);
    if (ppbVar9 == (byte **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00879f95:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    this->scopeInfoRelativeOffsets = ppbVar9;
    if (this->scopeInfoCount != 0) {
      buffer = this->reader->scopeInfoRelativeOffsets;
      uVar12 = 0;
      do {
        pBVar2 = this->reader;
        buffer = ByteCodeBufferReader::ReadConstantSizedInt32
                           (buffer,(size_t)(pBVar2->raw + ((long)pBVar2->totalSize - (long)buffer)),
                            (int *)((long)&uStack_38 + 4));
        pbVar10 = pBVar2->raw + uStack_38._4_4_;
        if ((long)uStack_38._4_4_ == 0) {
          pbVar10 = (byte *)0x0;
        }
        this->scopeInfoRelativeOffsets[uVar12] = pbVar10;
        uVar12 = uVar12 + 1;
      } while (uVar12 < this->scopeInfoCount);
    }
  }
  return;
}

Assistant:

void ByteCodeCache::Initialize(ScriptContext * scriptContext)
{
    auto alloc = scriptContext->SourceCodeAllocator();
    propertyCount = reader->string16Count;
    propertyIds = AnewArray(alloc, PropertyId, propertyCount);
    for (auto i = 0; i < propertyCount; ++i)
    {
        propertyIds[i] = -1;
    }

    raw = reader->raw;

    // Read and populate PropertyIds
    for (int i = 0; i < propertyCount; ++i)
    {
        PopulateLookupPropertyId(scriptContext, i);
    }

    scopeInfoCount = reader->scopeInfoCount;
    if (scopeInfoCount > 0)
    {
        scopeInfoRelativeOffsets = AnewArray(alloc, const byte*, scopeInfoCount);

        const byte* current = reader->scopeInfoRelativeOffsets;
        for (uint i = 0; i < scopeInfoCount; i++)
        {
            const byte* ptr = nullptr;
            current = reader->ReadOffsetAsPointer(current, &ptr);

            scopeInfoRelativeOffsets[i] = ptr;
        }
    }
}